

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::garbageCollect(Solver *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined1 local_28 [8];
  ClauseAllocator to;
  Solver *this_local;
  
  to.super_RegionAllocator<unsigned_int>._16_8_ = this;
  uVar1 = RegionAllocator<unsigned_int>::size(&(this->ca).super_RegionAllocator<unsigned_int>);
  uVar2 = RegionAllocator<unsigned_int>::wasted(&(this->ca).super_RegionAllocator<unsigned_int>);
  ClauseAllocator::ClauseAllocator((ClauseAllocator *)local_28,uVar1 - uVar2);
  relocAll(this,(ClauseAllocator *)local_28);
  if (1 < this->verbosity) {
    uVar1 = RegionAllocator<unsigned_int>::size(&(this->ca).super_RegionAllocator<unsigned_int>);
    uVar2 = RegionAllocator<unsigned_int>::size((RegionAllocator<unsigned_int> *)local_28);
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",(ulong)(uVar1 << 2),
           (ulong)(uVar2 << 2));
  }
  ClauseAllocator::moveTo((ClauseAllocator *)local_28,&this->ca);
  ClauseAllocator::~ClauseAllocator((ClauseAllocator *)local_28);
  return;
}

Assistant:

void Solver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}